

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

bool __thiscall TestBranchNoName::Run(TestBranchNoName *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  Outputter *outputter;
  TestRegistry *this_00;
  long lVar4;
  bool bVar5;
  Results rs;
  TestBranchInternal2 myTestA;
  ostringstream oss;
  string local_218;
  Results local_1f0;
  Test local_1d8;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  outputter = (Outputter *)operator_new(0x18);
  outputter->_vptr_Outputter = (_func_int **)&PTR_startRun_0016a880;
  outputter[1]._vptr_Outputter = (_func_int **)local_198;
  *(undefined4 *)&outputter[2]._vptr_Outputter = 1;
  paVar1 = &local_218.field_2;
  local_218._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"A","");
  TestBranchInternal2::TestBranchInternal2((TestBranchInternal2 *)&local_1d8,&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  local_218._M_dataplus._M_p = (pointer)0x0;
  local_218.field_2._M_allocated_capacity = 0;
  local_218._M_string_length = 100;
  this_00 = testinator::TestRegistry::Instance();
  testinator::TestRegistry::RunAllTests(&local_1f0,this_00,(RunParams *)&local_218,outputter);
  if (Run()::expected_abi_cxx11_ == '\0') {
    iVar3 = __cxa_guard_acquire(&Run()::expected_abi_cxx11_);
    if (iVar3 != 0) {
      Run()::expected_abi_cxx11_._M_dataplus._M_p = (pointer)&Run()::expected_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&Run()::expected_abi_cxx11_,"main.cpp:448","");
      __cxa_atexit(std::__cxx11::string::~string,&Run()::expected_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&Run()::expected_abi_cxx11_);
    }
  }
  if ((local_1f0.super__Vector_base<testinator::Result,_std::allocator<testinator::Result>_>._M_impl
       .super__Vector_impl_data._M_start ==
       local_1f0.super__Vector_base<testinator::Result,_std::allocator<testinator::Result>_>._M_impl
       .super__Vector_impl_data._M_finish) ||
     ((local_1f0.super__Vector_base<testinator::Result,_std::allocator<testinator::Result>_>._M_impl
       .super__Vector_impl_data._M_start)->m_success != true)) {
    bVar2 = false;
    bVar5 = false;
  }
  else {
    std::__cxx11::stringbuf::str();
    lVar4 = std::__cxx11::string::find
                      ((char *)&local_218,(ulong)Run()::expected_abi_cxx11_._M_dataplus._M_p,0);
    bVar5 = lVar4 != -1;
    bVar2 = true;
  }
  if ((bVar2) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1)) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  std::vector<testinator::Result,_std::allocator<testinator::Result>_>::~vector(&local_1f0);
  local_1d8._vptr_Test = (_func_int **)&PTR__Test_0016a498;
  testinator::TestRegistry::Unregister(local_1d8.m_registry,&local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8.m_name._M_dataplus._M_p != &local_1d8.m_name.field_2) {
    operator_delete(local_1d8.m_name._M_dataplus._M_p,
                    local_1d8.m_name.field_2._M_allocated_capacity + 1);
  }
  (*outputter->_vptr_Outputter[8])(outputter);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return bVar5;
}

Assistant:

virtual bool Run()
  {
    ostringstream oss;
    std::unique_ptr<testinator::Outputter> op =
      make_unique<testinator::DefaultOutputter>(oss);
    TestBranchInternal2 myTestA("A");
    testinator::Results rs = testinator::RunAllTests(testinator::RunParams(), op.get());

    static string expected = "main.cpp:448";
    return !rs.empty() && rs.front().m_success
      && oss.str().find(expected) != string::npos;
  }